

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

int do_setsockopt_set<unsigned_int>
              (void *optval_,size_t optvallen_,
              set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *set_)

{
  long in_RSI;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *in_RDI;
  undefined4 local_4;
  
  if ((in_RSI == 0) &&
     (in_RDI == (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x0)) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::clear
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x2bc3bd
              );
    local_4 = 0;
  }
  else if ((in_RSI == 4) &&
          (in_RDI != (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     0x0)) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
              (in_RDI,(value_type_conflict3 *)0x4);
    local_4 = 0;
  }
  else {
    local_4 = sockopt_invalid();
  }
  return local_4;
}

Assistant:

static int do_setsockopt_set (const void *const optval_,
                              const size_t optvallen_,
                              std::set<T> *const set_)
{
    if (optvallen_ == 0 && optval_ == NULL) {
        set_->clear ();
        return 0;
    }
    if (optvallen_ == sizeof (T) && optval_ != NULL) {
        set_->insert (*(static_cast<const T *> (optval_)));
        return 0;
    }
    return sockopt_invalid ();
}